

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_vector_of_tags.hpp
# Opt level: O0

void __thiscall
cfgfile::tag_vector_of_tags_t<cfgfile::generator::cfg::tag_class_t,_cfgfile::string_trait_t>::
on_finish(tag_vector_of_tags_t<cfgfile::generator::cfg::tag_class_t,_cfgfile::string_trait_t> *this,
         parser_info_t<cfgfile::string_trait_t> *info)

{
  element_type *peVar1;
  undefined8 in_RSI;
  tag_t<cfgfile::string_trait_t> *in_RDI;
  __shared_ptr<cfgfile::generator::cfg::tag_class_t,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  tag_t<cfgfile::string_trait_t> *__x;
  
  __x = in_RDI;
  peVar1 = std::
           __shared_ptr_access<cfgfile::generator::cfg::tag_class_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cfgfile::generator::cfg::tag_class_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x129450);
  (*(peVar1->
    super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
    ).super_tag_t<cfgfile::string_trait_t>._vptr_tag_t[5])(peVar1,in_RSI);
  std::
  vector<std::shared_ptr<cfgfile::generator::cfg::tag_class_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_class_t>_>_>
  ::push_back((vector<std::shared_ptr<cfgfile::generator::cfg::tag_class_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_class_t>_>_>
               *)unaff_retaddr,(value_type *)__x);
  std::__shared_ptr<cfgfile::generator::cfg::tag_class_t,_(__gnu_cxx::_Lock_policy)2>::reset
            (unaff_retaddr);
  tag_t<cfgfile::string_trait_t>::set_defined(in_RDI,true);
  return;
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		m_current->on_finish( info );
		m_tags.push_back( m_current );
		m_current.reset();

		this->set_defined();
	}